

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall OPL3::update_7_NEW1(OPL3 *this)

{
  byte bVar1;
  
  bVar1 = this->registers[0x105];
  this->_new = bVar1 & 1;
  if ((bVar1 & 1) != 0) {
    setEnabledChannels(this);
  }
  set4opConnections(this);
  updateChannelPans(this);
  return;
}

Assistant:

void OPL3::update_7_NEW1() {
	int _7_new1 = registers[OPL3DataStruct::_7_NEW1_Offset];
    // OPL2/OPL3 mode selection. This register is used in 
    // OPL3.read(), OPL3.write() and Operator.getOperatorOutput();
    _new = (_7_new1 & 0x01);
    if(_new==1) setEnabledChannels();
    set4opConnections();
	updateChannelPans();
}